

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void absl::lts_20250127::container_internal::ResetGrowthLeft(CommonFields *common)

{
  GrowthInfo *pGVar1;
  size_t sVar2;
  
  pGVar1 = CommonFields::growth_info(common);
  sVar2 = CapacityToGrowth(common->capacity_);
  pGVar1->growth_left_info_ = sVar2 - (common->size_ >> 1);
  return;
}

Assistant:

inline void ResetGrowthLeft(CommonFields& common) {
  common.growth_info().InitGrowthLeftNoDeleted(
      CapacityToGrowth(common.capacity()) - common.size());
}